

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  ValueFederate *in_stack_00000010;
  
  ~ValueFederate(in_stack_00000010);
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}